

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::InitialPass
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  size_type sVar2;
  undefined1 local_88 [8];
  string e;
  string *subCommand;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"must be called with at least two arguments.",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    e.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local,0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            e.field_2._8_8_,"WRITE");
    if (bVar1) {
      this_local._7_1_ =
           HandleWriteCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)param_2_local,false);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              e.field_2._8_8_,"APPEND");
      if (bVar1) {
        this_local._7_1_ =
             HandleWriteCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)param_2_local,true);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )e.field_2._8_8_,"DOWNLOAD");
        if (bVar1) {
          this_local._7_1_ =
               HandleDownloadCommand
                         (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)e.field_2._8_8_,"UPLOAD");
          if (bVar1) {
            this_local._7_1_ =
                 HandleUploadCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)param_2_local);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)e.field_2._8_8_,"READ");
            if (bVar1) {
              this_local._7_1_ =
                   HandleReadCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)param_2_local);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)e.field_2._8_8_,"MD5");
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)e.field_2._8_8_,"SHA1");
                if (!bVar1) {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)e.field_2._8_8_,"SHA224");
                  if (!bVar1) {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)e.field_2._8_8_,"SHA256");
                    if (!bVar1) {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)e.field_2._8_8_,"SHA384");
                      if (!bVar1) {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)e.field_2._8_8_,"SHA512");
                        if (!bVar1) {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"SHA3_224");
                          if (!bVar1) {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"SHA3_256");
                            if (!bVar1) {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"SHA3_384");
                              if (!bVar1) {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"SHA3_512");
                                if (!bVar1) {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"STRINGS");
                                  if (bVar1) {
                                    this_local._7_1_ =
                                         HandleStringsCommand
                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"GLOB");
                                    if (bVar1) {
                                      this_local._7_1_ =
                                           HandleGlobCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,false);
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"GLOB_RECURSE");
                                      if (bVar1) {
                                        this_local._7_1_ =
                                             HandleGlobCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,true);
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"MAKE_DIRECTORY");
                                        if (bVar1) {
                                          this_local._7_1_ =
                                               HandleMakeDirectoryCommand
                                                         (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"RENAME");
                                          if (bVar1) {
                                            this_local._7_1_ =
                                                 HandleRename(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                          }
                                          else {
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"REMOVE");
                                            if (bVar1) {
                                              this_local._7_1_ =
                                                   HandleRemove(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,false);
                                            }
                                            else {
                                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"REMOVE_RECURSE");
                                              if (bVar1) {
                                                this_local._7_1_ =
                                                     HandleRemove(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,true);
                                              }
                                              else {
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"COPY");
                                                if (bVar1) {
                                                  this_local._7_1_ =
                                                       HandleCopyCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                }
                                                else {
                                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"INSTALL");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleInstallCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"DIFFERENT");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleDifferentCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"RPATH_CHANGE");
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"CHRPATH");
                                                  if (!bVar1) {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"RPATH_CHECK");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleRPathCheckCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"RPATH_REMOVE");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleRPathRemoveCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"READ_ELF");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleReadElfCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"RELATIVE_PATH");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleRelativePathCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"TO_CMAKE_PATH");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleCMakePathCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,false);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"TO_NATIVE_PATH");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleCMakePathCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,true);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"TOUCH");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleTouchCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,true);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"TOUCH_NOCREATE");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleTouchCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,false);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"TIMESTAMP");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleTimestampCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"GENERATE");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleGenerateCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"LOCK");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleLockCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"SIZE");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleSizeCommand(this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"READ_SYMLINK");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleReadSymlinkCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"CREATE_LINK");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleCreateLinkCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_,"GET_RUNTIME_DEPENDENCIES");
                                                  if (bVar1) {
                                                    this_local._7_1_ =
                                                         HandleGetRuntimeDependenciesCommand
                                                                   (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  else {
                                                    std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88,"does not recognize sub-command ",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)e.field_2._8_8_);
                                                  cmCommand::SetError(&this->super_cmCommand,
                                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88);
                                                  this_local._7_1_ = 0;
                                                  std::__cxx11::string::~string((string *)local_88);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_0023b207;
                                                  }
                                                  }
                                                  this_local._7_1_ =
                                                       HandleRPathChangeCommand
                                                                 (this,(
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local);
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  goto LAB_0023b207;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              this_local._7_1_ =
                   HandleHashCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)param_2_local);
            }
          }
        }
      }
    }
  }
LAB_0023b207:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::InitialPass(std::vector<std::string> const& args,
                                cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("must be called with at least two arguments.");
    return false;
  }
  std::string const& subCommand = args[0];
  if (subCommand == "WRITE") {
    return this->HandleWriteCommand(args, false);
  }
  if (subCommand == "APPEND") {
    return this->HandleWriteCommand(args, true);
  }
  if (subCommand == "DOWNLOAD") {
    return this->HandleDownloadCommand(args);
  }
  if (subCommand == "UPLOAD") {
    return this->HandleUploadCommand(args);
  }
  if (subCommand == "READ") {
    return this->HandleReadCommand(args);
  }
  if (subCommand == "MD5" || subCommand == "SHA1" || subCommand == "SHA224" ||
      subCommand == "SHA256" || subCommand == "SHA384" ||
      subCommand == "SHA512" || subCommand == "SHA3_224" ||
      subCommand == "SHA3_256" || subCommand == "SHA3_384" ||
      subCommand == "SHA3_512") {
    return this->HandleHashCommand(args);
  }
  if (subCommand == "STRINGS") {
    return this->HandleStringsCommand(args);
  }
  if (subCommand == "GLOB") {
    return this->HandleGlobCommand(args, false);
  }
  if (subCommand == "GLOB_RECURSE") {
    return this->HandleGlobCommand(args, true);
  }
  if (subCommand == "MAKE_DIRECTORY") {
    return this->HandleMakeDirectoryCommand(args);
  }
  if (subCommand == "RENAME") {
    return this->HandleRename(args);
  }
  if (subCommand == "REMOVE") {
    return this->HandleRemove(args, false);
  }
  if (subCommand == "REMOVE_RECURSE") {
    return this->HandleRemove(args, true);
  }
  if (subCommand == "COPY") {
    return this->HandleCopyCommand(args);
  }
  if (subCommand == "INSTALL") {
    return this->HandleInstallCommand(args);
  }
  if (subCommand == "DIFFERENT") {
    return this->HandleDifferentCommand(args);
  }
  if (subCommand == "RPATH_CHANGE" || subCommand == "CHRPATH") {
    return this->HandleRPathChangeCommand(args);
  }
  if (subCommand == "RPATH_CHECK") {
    return this->HandleRPathCheckCommand(args);
  }
  if (subCommand == "RPATH_REMOVE") {
    return this->HandleRPathRemoveCommand(args);
  }
  if (subCommand == "READ_ELF") {
    return this->HandleReadElfCommand(args);
  }
  if (subCommand == "RELATIVE_PATH") {
    return this->HandleRelativePathCommand(args);
  }
  if (subCommand == "TO_CMAKE_PATH") {
    return this->HandleCMakePathCommand(args, false);
  }
  if (subCommand == "TO_NATIVE_PATH") {
    return this->HandleCMakePathCommand(args, true);
  }
  if (subCommand == "TOUCH") {
    return this->HandleTouchCommand(args, true);
  }
  if (subCommand == "TOUCH_NOCREATE") {
    return this->HandleTouchCommand(args, false);
  }
  if (subCommand == "TIMESTAMP") {
    return this->HandleTimestampCommand(args);
  }
  if (subCommand == "GENERATE") {
    return this->HandleGenerateCommand(args);
  }
  if (subCommand == "LOCK") {
    return this->HandleLockCommand(args);
  }
  if (subCommand == "SIZE") {
    return this->HandleSizeCommand(args);
  }
  if (subCommand == "READ_SYMLINK") {
    return this->HandleReadSymlinkCommand(args);
  }
  if (subCommand == "CREATE_LINK") {
    return this->HandleCreateLinkCommand(args);
  }
  if (subCommand == "GET_RUNTIME_DEPENDENCIES") {
    return this->HandleGetRuntimeDependenciesCommand(args);
  }

  std::string e = "does not recognize sub-command " + subCommand;
  this->SetError(e);
  return false;
}